

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::get(ArrayJoinPromiseNodeBase *this,ExceptionOrValue *output)

{
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this_00;
  bool bVar1;
  PromiseNode *pPVar2;
  Exception *exception_00;
  byte local_d2;
  Fault local_90;
  Fault f;
  uint *local_80;
  DebugComparison<unsigned_int_&,_int> local_78;
  bool local_49;
  Exception *pEStack_48;
  bool _kjCondition;
  Exception *exception;
  Exception *_exception2825;
  Branch *branch;
  Branch *__end2;
  Branch *__begin2;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *__range2;
  ExceptionOrValue *output_local;
  ArrayJoinPromiseNodeBase *this_local;
  
  __begin2 = (Branch *)&this->branches;
  __range2 = (Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *)output;
  output_local = (ExceptionOrValue *)this;
  __end2 = Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::begin
                     ((Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *)__begin2);
  branch = Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::end
                     ((Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *)__begin2);
  for (; __end2 != branch; __end2 = __end2 + 1) {
    _exception2825 = (Exception *)__end2;
    if (this->joinBehavior == LAZY) {
      pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&__end2->dependency);
      (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])
                (pPVar2,(_exception2825->remoteTrace).content.ptr);
    }
    exception = readMaybe<kj::Exception>
                          ((Maybe<kj::Exception> *)(_exception2825->remoteTrace).content.ptr);
    this_00 = __range2;
    if (exception != (Exception *)0x0) {
      pEStack_48 = exception;
      exception_00 = mv<kj::Exception>(exception);
      ExceptionOrValue::addException((ExceptionOrValue *)this_00,exception_00);
    }
  }
  local_80 = (uint *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->countLeft);
  f.exception._4_4_ = 0;
  DebugExpression<unsigned_int&>::operator==
            (&local_78,(DebugExpression<unsigned_int&> *)&local_80,(int *)((long)&f.exception + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_78);
  local_d2 = 1;
  if (!bVar1) {
    bVar1 = Maybe<kj::Exception>::operator==((Maybe<kj::Exception> *)__range2);
    local_d2 = bVar1 ^ 0xff;
  }
  local_49 = (bool)(local_d2 & 1);
  if (local_49 == false) {
    Debug::Fault::Fault<kj::Exception::Type,bool&>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xb0f,FAILED,"countLeft == 0 || output.exception != kj::none","_kjCondition,",
               &local_49);
    Debug::Fault::fatal(&local_90);
  }
  bVar1 = Maybe<kj::Exception>::operator==((Maybe<kj::Exception> *)__range2);
  if (bVar1) {
    (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,__range2)
    ;
  }
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  for (auto& branch: branches) {
    if (joinBehavior == ArrayJoinBehavior::LAZY) {
      // This implements `joinPromises()`'s lazy evaluation semantics.
      branch.dependency->get(branch.output);
    }

    // If any of the elements threw exceptions, propagate them.
    KJ_IF_SOME(exception, branch.output.exception) {
      output.addException(kj::mv(exception));
    }
  }

  // We either failed fast, or waited for all promises.
  KJ_DASSERT(countLeft == 0 || output.exception != kj::none);

  if (output.exception == kj::none) {
    // No errors.  The template subclass will need to fill in the result.
    getNoError(output);
  }
}